

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<Object_Nested_Test<wchar_t>_>::CreateTest
          (TestFactoryImpl<Object_Nested_Test<wchar_t>_> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x188);
  Object_Nested_Test<wchar_t>::Object_Nested_Test((Object_Nested_Test<wchar_t> *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }